

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  int i;
  int iVar1;
  uint uVar2;
  char *pcVar3;
  FILE *__stream;
  object *poVar4;
  long lVar5;
  object *poVar6;
  ulong uVar7;
  int iVar8;
  object *aProcess;
  char imageFileName [120];
  object *local_b8;
  int local_b0;
  int local_ac;
  char local_a8 [120];
  
  puts("Little Smalltalk starting up...");
  builtin_strncpy(local_a8,"lst.img",8);
  tmpdir = "/tmp";
  prog_argc = argc;
  prog_argv = argv;
  pcVar3 = getenv("TMPDIR");
  if (pcVar3 != (char *)0x0) {
    tmpdir = strdup(pcVar3);
  }
  local_ac = 300000;
  local_b0 = 300000;
  if (1 < argc) {
    iVar8 = 1;
    local_b0 = 300000;
    local_ac = 300000;
    do {
      pcVar3 = argv[iVar8];
      iVar1 = strcmp(pcVar3,"-v");
      if (iVar1 == 0) {
        puts("Little Smalltalk, version 4.7.2");
      }
      else {
        iVar1 = strcmp(pcVar3,"-s");
        if (iVar1 == 0) {
          local_ac = atoi(argv[(long)iVar8 + 1]);
          iVar8 = iVar8 + 1;
        }
        else {
          iVar1 = strcmp(pcVar3,"-d");
          if (iVar1 == 0) {
            local_b0 = atoi(argv[(long)iVar8 + 1]);
            iVar8 = iVar8 + 1;
          }
          else {
            iVar1 = strcmp(pcVar3,"-g");
            if (iVar1 == 0) {
              info_impl("main",0x55,"Turning on debugging.");
              debugging = 1;
            }
            else {
              strcpy(local_a8,pcVar3);
            }
          }
        }
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 < argc);
  }
  info_impl("main",0x60,"Initializing GC memory pool.");
  gcinit(local_ac,local_b0);
  info_impl("main",100,"Reading in image from file %s.",local_a8);
  __stream = fopen(local_a8,"rb");
  if (__stream == (FILE *)0x0) {
    error_impl("main",0x69,"cannot open image file: %s!",local_a8);
  }
  uVar2 = fileIn((FILE *)__stream);
  info_impl("main",0x6c,"%d objs/cells in image.",(ulong)uVar2);
  fclose(__stream);
  info_impl("find_initial_method",0xe4,"Finding initial method.");
  info_impl("find_initial_method",0xe6,"Checking for web IDE.");
  poVar4 = lookupGlobal("WebIDE");
  if (poVar4 == (object *)0x0) {
    info_impl("find_initial_method",0xf4,"Checking for commandline REPL.");
    poVar4 = lookupGlobal("REPL");
    if (poVar4 != (object *)0x0) {
      initialMethod = dictLookup((object *)poVar4[2].header,"start");
      if (initialMethod == (object *)0x0) {
        error_impl("find_initial_method",0xfa,"Unable to find method #start in REPL class!");
      }
      pcVar3 = "Found #start method in REPL class.";
      iVar8 = 0xfd;
      goto LAB_001030d1;
    }
    error_impl("find_initial_method",0x102,"Unable to find start up class!");
  }
  else {
    initialMethod = dictLookup((object *)poVar4[2].header,"start");
    if (initialMethod == (object *)0x0) {
      error_impl("find_initial_method",0xec,"Unable to find method #start in WebIDE class!");
    }
    pcVar3 = "Found #start method in WebIDE class.";
    iVar8 = 0xef;
LAB_001030d1:
    info_impl("find_initial_method",iVar8,pcVar3);
  }
  addStaticRoot(&initialMethod);
  if (debugging != 0) {
    dumpMethod(initialMethod,0);
  }
  info_impl("main",0x7a,"Setting up root process.");
  local_b8 = (object *)&memoryPointer[-3].class;
  memoryPointer = local_b8;
  if ((long)local_b8 < (long)memoryBase) {
    local_b8 = gcollect(3);
  }
  else {
    *(object **)local_b8 = (object *)0xc;
  }
  poVar4 = lookupGlobal("Process");
  local_b8->class = poVar4;
  lVar5 = 0;
  do {
    (&local_b8[1].header)[lVar5] = (uintptr_t)nilObject;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  addStaticRoot(&local_b8);
  info_impl("main",0x83,"Setting up root context.");
  poVar4 = (object *)&memoryPointer[-5].class;
  memoryPointer = poVar4;
  if ((long)poVar4 < (long)memoryBase) {
    poVar4 = gcollect(7);
  }
  else {
    *(object **)poVar4 = (object *)0x1c;
  }
  poVar4->class = ContextClass;
  lVar5 = 2;
  do {
    (&poVar4->header)[lVar5] = (uintptr_t)nilObject;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 9);
  local_b8[1].header = (uintptr_t)poVar4;
  uVar2 = (uint)((ulong)initialMethod[2].class >> 1);
  poVar6 = (object *)((long)&memoryPointer->header + (long)(int)(uVar2 * -8 + -0x10));
  memoryPointer = poVar6;
  if ((long)poVar6 < (long)memoryBase) {
    poVar6 = gcollect(uVar2);
  }
  else {
    poVar6->header = (ulong)(uVar2 * 4);
  }
  poVar4[2].class = poVar6;
  poVar6->class = ArrayClass;
  if (0 < (int)uVar2) {
    uVar7 = 0;
    do {
      (&poVar4[2].class[1].header)[uVar7] = (uintptr_t)nilObject;
      uVar7 = uVar7 + 1;
    } while ((uVar2 & 0x7fffffff) != uVar7);
  }
  poVar4[1].class = nilObject;
  poVar6 = (object *)&memoryPointer[-0xb].class;
  memoryPointer = poVar6;
  if ((long)poVar6 < (long)memoryBase) {
    poVar6 = gcollect(0x13);
  }
  else {
    *(object **)poVar6 = (object *)0x4c;
  }
  poVar4[2].header = (uintptr_t)poVar6;
  poVar6->class = ArrayClass;
  lVar5 = 2;
  do {
    *(object **)(poVar4[2].header + lVar5 * 8) = nilObject;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x15);
  poVar4[3].header = 1;
  poVar4[3].class = (object *)0x1;
  poVar4[4].header = (uintptr_t)nilObject;
  poVar4[1].header = (uintptr_t)initialMethod;
  lVar5 = (long)rootTop;
  rootTop = rootTop + 1;
  rootStack[lVar5] = local_b8;
  info_impl("main",0xae,"Starting execution.");
  iVar8 = execute(local_b8,0);
  switch(iVar8) {
  case 2:
    pcVar3 = "User defined return";
    break;
  case 3:
    puts("can\'t find method in call");
    lVar5 = (long)rootTop;
    rootTop = rootTop + -1;
    local_b8 = (&oldTop)[lVar5];
    printf("Unknown method: %s\n",local_b8[2].header + 0x10);
    backTrace((object *)local_b8[1].header);
    goto LAB_001033ae;
  case 4:
    pcVar3 = "normal return";
    break;
  case 5:
    pcVar3 = "time out";
    break;
  default:
    pcVar3 = "unknown return code";
  }
  puts(pcVar3);
LAB_001033ae:
  if (cache_miss + cache_hit != 0 && SCARRY8(cache_miss,cache_hit) == cache_miss + cache_hit < 0) {
    puts("\nCache statistics:");
    printf("  %ld hit, %ld miss for %02.2f%% hit rate.\n",
           (double)(float)(((double)cache_hit * 100.0) / (double)(cache_miss + cache_hit)));
  }
  puts("\nGC statistics:");
  printf("  %ld garbage collections\n",gc_count);
  if (0 < gc_count) {
    printf("  %ld total microseconds in GC for %ld microseconds per GC pass.\n",gc_total_time,
           gc_total_time / gc_count);
    printf("  %ld microseconds for longest GC pause.\n",gc_max_time);
    printf("  %ld total bytes copied for %ld bytes per GC on average.\n",gc_total_mem_copied,
           gc_total_mem_copied / gc_count);
    printf("  %ld maximum bytes copied during GC.\n",gc_mem_max_copied);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    struct object *aProcess, *aContext, *o;
    int size, i, staticSize, dynamicSize;
    FILE *fp;
    char imageFileName[120], *p;

    printf("Little Smalltalk starting up...\n");

    prog_argc = argc;
    prog_argv = (const char **)argv;

    strcpy(imageFileName, DefaultImageFile);
    staticSize = DefaultStaticSize;
    dynamicSize = DefaultDynamicSize;
    tmpdir = DefaultTmpdir;

    /*
     * See if our environment tells us what TMPDIR to use
     */
    p = getenv("TMPDIR");
    if (p) {
        tmpdir = strdup(p);
    }

    /* first parse arguments */
    for (i = 1; i < argc; i++) {
        if (strcmp(argv[i], "-v") == 0) {
            /* FIXME - this should be generated by CMake. */
            printf("Little Smalltalk, version " VERSION_STRING "\n");
        } else if (strcmp(argv[i], "-s") == 0) {
            staticSize = atoi(argv[++i]);
        } else if (strcmp(argv[i], "-d") == 0) {
            dynamicSize = atoi(argv[++i]);
        } else if (strcmp(argv[i], "-g") == 0) {
            info("Turning on debugging.");
            debugging = 1;
        } else {
            strcpy(imageFileName, argv[i]);
        }
    }

# ifdef COUNTTEMPS
    tempFile = fopen("/usr/tmp/counts", "w");
# endif

    info("Initializing GC memory pool.");

    gcinit(staticSize, dynamicSize);

    info("Reading in image from file %s.", imageFileName);

    /* read in the method from the image file */
    fp = fopen(imageFileName, "rb");
    if (! fp) {
        error("cannot open image file: %s!", imageFileName);
    }

    info("%d objs/cells in image.", fileIn(fp));
    fclose(fp);

    /* find the initial method. */
    find_initial_method();
    addStaticRoot(&initialMethod);

    if(debugging) {
        /* dump startup method */
        dumpMethod(initialMethod, 0);
    }

    /* build the root process with a context, make sure it is GC-proof */

    info("Setting up root process.");

    aProcess = gcalloc(processSize);
    aProcess->class = lookupGlobal("Process");
    for(int i=0; i< processSize; i++) {
        aProcess->data[i] = nilObject;
    }
    addStaticRoot(&aProcess);

    info("Setting up root context.");

    /* context should be dynamic */
    aContext = gcalloc(contextSize);
    aContext->class = ContextClass;
    for(int i=0; i< contextSize; i++) {
        aContext->data[i] = nilObject;
    }

    /* add the context to the process. */
    aProcess->data[contextInProcess] = aContext;

    /* set up context stack */
    size = integerValue(initialMethod->data[stackSizeInMethod]);
    aContext->data[stackInContext] = gcalloc(size);
    aContext->data[stackInContext]->class = ArrayClass;
    for(int i=0; i < size; i++) {
        aContext->data[stackInContext]->data[i] = nilObject;
    }

    /* set up arguments, none. */
    aContext->data[argumentsInContext] = nilObject;

    /* set up temporary array. */
    size = 19;  /* where is this number from? */
    aContext->data[temporariesInContext] = gcalloc(size);
    aContext->data[temporariesInContext]->class = ArrayClass;
    for(int i=0; i < size; i++) {
        aContext->data[temporariesInContext]->data[i] = nilObject;
    }

    aContext->data[bytePointerInContext] = newInteger(0);
    aContext->data[stackTopInContext] = newInteger(0);
    aContext->data[previousContextInContext] = nilObject;
    aContext->data[methodInContext] = initialMethod;

    /* now go do it */
    rootStack[rootTop++] = aProcess;

#if defined(PROFILE)
    take_samples(1);
#endif

    info("Starting execution.");

    switch(execute(aProcess, 0)) {
    case 2:
        printf("User defined return\n");
        break;

    case 3:
        printf("can't find method in call\n");
        aProcess = rootStack[--rootTop];
        o = aProcess->data[resultInProcess];
        printf("Unknown method: %s\n", bytePtr(o));
        aContext = aProcess->data[contextInProcess];
        backTrace(aContext);
        break;

    case 4:
        printf("normal return\n");
        break;

    case 5:
        printf("time out\n");
        break;

    default:
        printf("unknown return code\n");
        break;
    }
#if defined(VSTA) && defined(PROFILE)
    dump_samples();
#endif

    if((cache_hit + cache_miss) > 0) {
        printf("\nCache statistics:\n");
        printf("  %" PRId64 " hit, %" PRId64 " miss for %02.2f%% hit rate.\n", cache_hit, cache_miss, (float)((float)(cache_hit)*100.0/(float)(cache_hit + cache_miss)));
    }

    printf("\nGC statistics:\n");
    printf("  %" PRId64 " garbage collections\n", gc_count);
    if(gc_count > 0) {
        printf("  %" PRId64 " total microseconds in GC for %" PRId64 " microseconds per GC pass.\n", gc_total_time, gc_total_time/gc_count);
        printf("  %" PRId64 " microseconds for longest GC pause.\n", gc_max_time);
        printf("  %" PRId64 " total bytes copied for %" PRId64 " bytes per GC on average.\n", gc_total_mem_copied, gc_total_mem_copied/gc_count);
        printf("  %" PRId64 " maximum bytes copied during GC.\n", gc_mem_max_copied);
    }

    return(0);
}